

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_GetSetY_Test::TestBody(Image_GetSetY_Test *this)

{
  PixelFormat format;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Allocator alloc;
  long lVar3;
  long lVar4;
  char *pcVar5;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar6;
  ColorEncodingHandle *encoding;
  long lVar7;
  int x;
  long lVar8;
  long lVar9;
  Tuple2<pbrt::Point2,_int> p;
  bool bVar10;
  undefined1 auVar11 [16];
  Float FVar12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  undefined4 local_270 [3];
  Float v;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Tuple2<pbrt::Point2,_int> local_220;
  ImageChannelValues cv;
  long local_1e0;
  WrapMode2D local_1c8;
  WrapMode2D local_1c0;
  WrapMode2D local_1b8;
  ColorEncodingHandle local_1b0;
  PixelFormat local_1a4 [3];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> yPixels;
  ImageChannelDesc yDesc;
  Image image;
  
  GetFloatPixels(&yPixels,(Point2i)0x300000009,1);
  local_1a4[0] = U256;
  local_1a4[1] = Half;
  lVar3 = 0;
  local_1a4[2] = 2;
  do {
    if (lVar3 == 0xc) {
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&yPixels);
      return;
    }
    format = *(PixelFormat *)((long)local_1a4 + lVar3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&yDesc,"Y",(allocator<char> *)&cv);
    local_1b0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_1b0;
    channels.n = 1;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&yDesc;
    pbrt::Image::Image(&image,format,(Point2i)0x300000009,channels,encoding,alloc);
    std::__cxx11::string::~string((string *)&yDesc);
    lVar9 = 0;
    lVar7 = 0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar8 = 0; lVar8 != 9; lVar8 = lVar8 + 1) {
        pbrt::Image::SetChannel
                  (&image,(Point2i)(lVar9 + lVar8),0,
                   *(Float *)((long)yPixels.ptr + lVar8 * 4 + lVar7));
      }
      lVar7 = lVar7 + 0x24;
      lVar9 = lVar9 + 0x100000000;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cv,"Y",(allocator<char> *)&gtest_ar_);
    requestedChannels.n = 1;
    requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cv
    ;
    pbrt::Image::GetChannelDesc(&yDesc,&image,requestedChannels);
    std::__cxx11::string::~string((string *)&cv);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = yDesc.offset.nStored != 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cv,(internal *)&gtest_ar_,(AssertionResult *)"bool(yDesc)","false",
                 "true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x74,(char *)cv.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .alloc.memoryResource);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_270,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
      std::__cxx11::string::~string((string *)&cv);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"Y0L0",(allocator<char> *)local_270);
    requestedChannels_00.n = 1;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_;
    pbrt::Image::GetChannelDesc((ImageChannelDesc *)&cv,&image,requestedChannels_00);
    gtest_ar__1.success_ =
         cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored == 0;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&cv);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (gtest_ar__1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cv,(internal *)&gtest_ar__1,
                 (AssertionResult *)"bool(image.GetChannelDesc({\"Y0L0\"}))","true","false",
                 (char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x75,(char *)cv.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .alloc.memoryResource);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_270,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
      std::__cxx11::string::~string((string *)&cv);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    local_220.x = 0;
    local_220.y = 0;
    local_1e0 = 0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      lVar7 = 9;
      lVar9 = local_1e0;
      p = local_220;
      while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
        pbrt::WrapMode2D::WrapMode2D(&local_1b8,Clamp);
        v = pbrt::Image::GetChannel(&image,(Point2i)p,0,local_1b8);
        pbrt::WrapMode2D::WrapMode2D(&local_1c0,Clamp);
        pbrt::Image::GetChannels(&cv,&image,(Point2i)p,local_1c0);
        local_270[0] = 1;
        gtest_ar__1._0_8_ =
             cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar_,"1","cv.size()",(int *)local_270,
                   (unsigned_long *)&gtest_ar__1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          pcVar5 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_270,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7b,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_270,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__1);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar6 = &cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar_,"v","cv[0]",&v,paVar6->fixed);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          pcVar5 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_270,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7c,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_270,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__1);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        pbrt::WrapMode2D::WrapMode2D(&local_1c8,Clamp);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)&gtest_ar_,&image,(Point2i)p,&yDesc,local_1c8);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                   (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&gtest_ar_);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&gtest_ar_);
        local_270[0] = 1;
        gtest_ar__1._0_8_ =
             cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar_,"1","cv.size()",(int *)local_270,
                   (unsigned_long *)&gtest_ar__1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          pcVar5 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_270,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7f,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_270,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__1);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar6 = &cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar_,"v","cv[0]",&v,paVar6->fixed);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          pcVar5 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_270,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x80,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_270,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__1);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        if (format == U256) {
          local_270[0] = 0x3b00c24b;
          auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                               ZEXT416(*(uint *)((long)yPixels.ptr + lVar9)));
          uVar1 = vcmpss_avx512f(ZEXT416(*(uint *)((long)yPixels.ptr + lVar9)),ZEXT816(0) << 0x40,1)
          ;
          auVar2._8_4_ = 0x7fffffff;
          auVar2._0_8_ = 0x7fffffff7fffffff;
          auVar2._12_4_ = 0x7fffffff;
          auVar11 = vandps_avx512vl(ZEXT416((uint)(v - (float)((uint)!(bool)((byte)uVar1 & 1) *
                                                              auVar11._0_4_))),auVar2);
          gtest_ar__1._0_4_ = auVar11._0_4_;
          testing::internal::CmpHelperLT<float,float>
                    ((internal *)&gtest_ar_,"std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1))",
                     "0.501f / 255.f",(float *)&gtest_ar__1,(float *)local_270);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            std::ostream::operator<<((void *)(gtest_ar__1._0_8_ + 0x10),v);
            std::operator<<((ostream *)(gtest_ar__1._0_8_ + 0x10)," vs ");
            auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416(*(uint *)((long)yPixels.ptr + lVar9)));
            uVar1 = vcmpss_avx512f(ZEXT416(*(uint *)((long)yPixels.ptr + lVar9)),ZEXT816(0) << 0x40,
                                   1);
            std::ostream::operator<<
                      ((void *)(gtest_ar__1._0_8_ + 0x10),
                       (float)((uint)!(bool)((byte)uVar1 & 1) * auVar11._0_4_));
            pcVar5 = "";
            if (gtest_ar_.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_270,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x84,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_270,(Message *)&gtest_ar__1);
            goto LAB_003433aa;
          }
        }
        else {
          FVar12 = modelQuantization(*(Float *)((long)yPixels.ptr + lVar9),format);
          gtest_ar__1._0_4_ = FVar12;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&gtest_ar_,"v","modelQuantization(yPixels[y * res[0] + x], format)"
                     ,&v,(float *)&gtest_ar__1);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            pcVar5 = "";
            if (gtest_ar_.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_270,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x87,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_270,(Message *)&gtest_ar__1);
LAB_003433aa:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__1);
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  (&cv.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
        lVar9 = lVar9 + 4;
        p = (Tuple2<pbrt::Point2,_int>)((long)p + 1);
      }
      local_1e0 = local_1e0 + 0x24;
      local_220 = (Tuple2<pbrt::Point2,_int>)((long)local_220 + 0x100000000);
    }
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&yDesc.offset);
    pbrt::Image::~Image(&image);
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

TEST(Image, GetSetY) {
    Point2i res(9, 3);
    pstd::vector<float> yPixels = GetFloatPixels(res, 1);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"Y"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                image.SetChannel({x, y}, 0, yPixels[y * res[0] + x]);
            }

        ImageChannelDesc yDesc = image.GetChannelDesc({"Y"});
        EXPECT_TRUE(bool(yDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"Y0L0"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                Float v = image.GetChannel({x, y}, 0);
                ImageChannelValues cv = image.GetChannels({x, y});
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                cv = image.GetChannels({x, y}, yDesc);
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                if (format == PixelFormat::U256)
                    EXPECT_LT(std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1)),
                              0.501f / 255.f)
                        << v << " vs " << Clamp(yPixels[y * res[0] + x], 0, 1);
                else
                    EXPECT_EQ(v, modelQuantization(yPixels[y * res[0] + x], format));
            }
    }
}